

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::XFormWidget::drawCenterHandle(XFormWidget *this)

{
  double dVar1;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar4 = (this->center).x;
  dVar5 = (this->center).y;
  dVar3 = (this->bounds).max.x - (this->bounds).min.x;
  dVar13 = (this->bounds).max.y - (this->bounds).min.y;
  dVar1 = (this->center).z;
  dVar14 = (this->bounds).max.z - (this->bounds).min.z;
  dVar3 = SQRT(dVar14 * dVar14 + dVar3 * dVar3 + dVar13 * dVar13) * 0.5;
  glBegin(7);
  glColor4ubv((this->axisColors).
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  dVar13 = dVar3 * 0.15;
  uVar7 = 0;
  do {
    uVar8 = uVar7 + 1;
    bVar11 = false;
    uVar10 = 0;
    if (uVar8 != 3) {
      uVar10 = uVar8 & 0xffffffff;
    }
    uVar9 = ((int)uVar7 + 2U) % 3;
    uVar12 = 0xbff00000;
    do {
      dVar14 = (double)((ulong)uVar12 << 0x20) * dVar3 * 0.15;
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_98 = pVVar2[uVar7].z * dVar14 + dVar1;
      local_a8 = dVar14 * pVVar2[uVar7].x + dVar4;
      dStack_a0 = dVar14 * pVVar2[uVar7].y + dVar5;
      local_48 = (-pVVar2[uVar10].x - pVVar2[uVar9].x) * dVar13 + local_a8;
      dStack_40 = (-pVVar2[uVar10].y - pVVar2[uVar9].y) * dVar13 + dStack_a0;
      local_38 = (-pVVar2[uVar10].z - pVVar2[uVar9].z) * dVar13 + local_98;
      local_58 = (pVVar2[uVar9].z - pVVar2[uVar10].z) * dVar13 + local_98;
      local_68 = (pVVar2[uVar9].x - pVVar2[uVar10].x) * dVar13 + local_a8;
      dStack_60 = (pVVar2[uVar9].y - pVVar2[uVar10].y) * dVar13 + dStack_a0;
      local_78 = (pVVar2[uVar10].z - pVVar2[uVar9].z) * dVar13 + local_98;
      local_88 = (pVVar2[uVar10].x - pVVar2[uVar9].x) * dVar13 + local_a8;
      dStack_80 = (pVVar2[uVar10].y - pVVar2[uVar9].y) * dVar13 + dStack_a0;
      local_98 = (pVVar2[uVar10].z + pVVar2[uVar9].z) * dVar13 + local_98;
      local_a8 = (pVVar2[uVar9].x + pVVar2[uVar10].x) * dVar13 + local_a8;
      dStack_a0 = (pVVar2[uVar9].y + pVVar2[uVar10].y) * dVar13 + dStack_a0;
      glVertex3dv(&local_48);
      glVertex3dv(&local_68);
      glVertex3dv(&local_a8);
      glVertex3dv(&local_88);
      uVar12 = 0x3ff00000;
      bVar6 = !bVar11;
      bVar11 = true;
    } while (bVar6);
    uVar7 = uVar8;
  } while (uVar8 != 3);
  glEnd();
  return;
}

Assistant:

void XFormWidget::drawCenterHandle() const
{
   const double handleSize = .15;
   
   Vector3D c = center;

   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw center box
   glBegin( GL_QUADS );
   glColor4ubv( &axisColors[3][0] );
   for( int i = 0; i < 3; i++ )
   {
      for( double s = -1.; s <= 1.; s+= 2. )
      {
         Vector3D p = c + r*s*handleSize*axes[i];
         Vector3D p00 = p + r*handleSize*( -axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p01 = p + r*handleSize*( -axes[(i+1)%3] + axes[(i+2)%3] );
         Vector3D p10 = p + r*handleSize*(  axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p11 = p + r*handleSize*(  axes[(i+1)%3] + axes[(i+2)%3] );

         glVertex3dv( &p00.x );
         glVertex3dv( &p01.x );
         glVertex3dv( &p11.x );
         glVertex3dv( &p10.x );
      }
   }
   glEnd();
}